

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClauseVec.c
# Opt level: O1

Msat_ClauseVec_t * Msat_ClauseVecAlloc(int nCap)

{
  Msat_ClauseVec_t *pMVar1;
  Msat_Clause_t **ppMVar2;
  int iVar3;
  
  pMVar1 = (Msat_ClauseVec_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < nCap - 1U) {
    iVar3 = nCap;
  }
  pMVar1->nSize = 0;
  pMVar1->nCap = iVar3;
  if (iVar3 == 0) {
    ppMVar2 = (Msat_Clause_t **)0x0;
  }
  else {
    ppMVar2 = (Msat_Clause_t **)malloc((long)iVar3 << 3);
  }
  pMVar1->pArray = ppMVar2;
  return pMVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates a vector with the given capacity.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Msat_ClauseVec_t * Msat_ClauseVecAlloc( int nCap )
{
    Msat_ClauseVec_t * p;
    p = ABC_ALLOC( Msat_ClauseVec_t, 1 );
    if ( nCap > 0 && nCap < 16 )
        nCap = 16;
    p->nSize  = 0;
    p->nCap   = nCap;
    p->pArray = p->nCap? ABC_ALLOC( Msat_Clause_t *, p->nCap ) : NULL;
    return p;
}